

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult>::
addCase<3,3>(MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult> *this,
            CaseContext *ctx,TestCaseGroup *group)

{
  char *this_00;
  TestCaseGroup *context;
  char *__s;
  Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func;
  PrecisionCase *node;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *name;
  TestCaseGroup *group_local;
  CaseContext *ctx_local;
  MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::MatrixCompMult> *this_local;
  
  name = (char *)group;
  group_local = (TestCaseGroup *)ctx;
  ctx_local = (CaseContext *)this;
  __s = dataTypeNameOf<tcu::Matrix<float,3,3>>();
  context = group_local;
  this_00 = name;
  local_28 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  func = (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)instance<vkt::shaderexecutor::Functions::MatrixCompMult<3,3>>();
  node = createFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,3,3>,tcu::Matrix<float,3,3>,tcu::Matrix<float,3,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                   ((CaseContext *)context,&local_48,func);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)node);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void				addCase			(const CaseContext& ctx, TestCaseGroup* group) const
	{
		const char*	const name = dataTypeNameOf<Matrix<float, Rows, Cols> >();
		group->addChild(createFuncCase(ctx, name, instance<GenF<Rows, Cols> >()));
	}